

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_recv(telnet_t *telnet,char *buffer,size_t size)

{
  byte bVar1;
  short sVar2;
  telnet_state_t tVar3;
  uint uVar4;
  telnet_telopt_t *ptVar5;
  byte bVar6;
  byte bVar7;
  telnet_error_t tVar8;
  telnet_rfc1143_t *ptVar9;
  int *piVar10;
  ushort uVar11;
  uint *puVar12;
  uint *puVar13;
  char *func;
  void *pvVar14;
  size_t sVar15;
  uint uVar16;
  telnet_event_t *ptVar17;
  uint *in_R8;
  char *fmt;
  byte bVar18;
  ulong uVar19;
  long lVar20;
  char *in_stack_ffffffffffffff68;
  char acStack_84 [3];
  byte bStack_81;
  telnet_event_t tStack_80;
  telnet_event_t tStack_58;
  
  if (size != 0) {
    lVar20 = 0;
    sVar15 = 0;
    do {
      bVar6 = buffer[sVar15];
      tVar3 = telnet->state;
      bStack_81 = bVar6;
      if (TELNET_STATE_SB_DATA_IAC < tVar3) goto LAB_00102796;
      uVar16 = (uint)bVar6;
      switch(tVar3) {
      case TELNET_STATE_DATA:
        if (uVar16 == 0xd) {
          if ((telnet->flags & 0x42) == 2) {
            if ((char *)(sVar15 - lVar20) != (char *)0x0) {
              tStack_58.type = TELNET_EV_DATA;
              tStack_58.data.buffer = buffer + lVar20;
              tStack_58.data.size = (size_t)(char *)(sVar15 - lVar20);
              (*telnet->eh)(telnet,&tStack_58,telnet->ud);
            }
            telnet->state = TELNET_STATE_EOL;
          }
        }
        else if (uVar16 == 0xff) {
          if ((char *)(sVar15 - lVar20) != (char *)0x0) {
            tStack_58.type = TELNET_EV_DATA;
            tStack_58.data.buffer = buffer + lVar20;
            tStack_58.data.size = (size_t)(char *)(sVar15 - lVar20);
            (*telnet->eh)(telnet,&tStack_58,telnet->ud);
          }
          telnet->state = TELNET_STATE_IAC;
        }
        break;
      case TELNET_STATE_EOL:
        if (bVar6 == 10) {
          uVar19 = 0;
        }
        else {
          bStack_81 = 0xd;
          tStack_58.type = TELNET_EV_DATA;
          tStack_58.data.buffer = (char *)&bStack_81;
          tStack_58.data.size = 1;
          (*telnet->eh)(telnet,&tStack_58,telnet->ud);
          bStack_81 = buffer[sVar15];
          uVar19 = (ulong)(bStack_81 == 0);
        }
        lVar20 = uVar19 + sVar15;
        goto LAB_0010278f;
      case TELNET_STATE_IAC:
        switch(uVar16) {
        case 0xfa:
          telnet->state = TELNET_STATE_SB;
          break;
        case 0xfb:
          telnet->state = TELNET_STATE_WILL;
          break;
        case 0xfc:
          telnet->state = TELNET_STATE_WONT;
          break;
        case 0xfd:
          telnet->state = TELNET_STATE_DO;
          break;
        case 0xfe:
          telnet->state = TELNET_STATE_DONT;
          break;
        case 0xff:
          tStack_58.type = TELNET_EV_DATA;
          tStack_58.data.buffer = (char *)&bStack_81;
          tStack_58.data.size = 1;
          (*telnet->eh)(telnet,&tStack_58,telnet->ud);
          lVar20 = sVar15 + 1;
          telnet->state = TELNET_STATE_DATA;
          break;
        default:
          tStack_58.type = TELNET_EV_IAC;
          pvVar14 = telnet->ud;
          ptVar17 = &tStack_58;
          tStack_58.iac.cmd = bVar6;
          goto LAB_00102788;
        }
        break;
      default:
        bVar1 = telnet->flags;
        if ((bVar1 & 1) != 0) {
          (*(code *)(&DAT_00105568 +
                    *(int *)(&DAT_00105568 + (ulong)(tVar3 - TELNET_STATE_WILL) * 4)))();
          return;
        }
        uVar4 = telnet->q_cnt;
        puVar13 = (uint *)(ulong)uVar4;
        if (puVar13 != (uint *)0x0) {
          in_R8 = (uint *)0x0;
          do {
            if (telnet->q[(long)in_R8].telopt == bVar6) {
              uVar11 = (ushort)telnet->q[(long)in_R8].state << 8;
              goto LAB_00101df5;
            }
            in_R8 = (uint *)((long)in_R8 + 1);
          } while (puVar13 != in_R8);
        }
        uVar11 = 0;
LAB_00101df5:
        if (3 < tVar3 - TELNET_STATE_WILL) goto switchD_00101f36_default;
        in_R8 = &switchD_00101e19::switchdataD_00105578;
        bVar18 = (byte)(uVar11 >> 8);
        switch(tVar3) {
        case TELNET_STATE_WONT:
          switch(uVar11 >> 0xc) {
          case 1:
            bVar18 = bVar18 & 0xf;
            ptVar9 = telnet->q;
            if (uVar4 != 0) {
              puVar12 = (uint *)0x0;
              do {
                if (ptVar9[(long)puVar12].telopt == bVar6) {
                  ptVar9[(long)puVar12].state = bVar18;
                  if (bVar6 == 0) {
                    bVar7 = (bVar1 & 0x9e) + 0x20;
                    if (bVar18 != 1) {
                      bVar7 = bVar1 & 0x9e;
                    }
                    telnet->flags = bVar7;
                  }
                  goto LAB_001026f9;
                }
                puVar12 = (uint *)((long)puVar12 + 1);
              } while (puVar13 != puVar12);
            }
            if (uVar4 < telnet->q_size) {
LAB_001022a5:
              ptVar9[(long)puVar13].telopt = bVar6;
              ptVar9[(long)puVar13].state = bVar18;
              telnet->q_cnt = (int)puVar13 + 1;
            }
            else {
              ptVar9 = (telnet_rfc1143_t *)realloc(ptVar9,(ulong)(telnet->q_size + 4) * 2);
              if (ptVar9 != (telnet_rfc1143_t *)0x0) {
                uVar16 = telnet->q_size;
                *(undefined8 *)(ptVar9 + uVar16) = 0;
                telnet->q = ptVar9;
                telnet->q_size = uVar16 + 4;
                puVar13 = (uint *)(ulong)telnet->q_cnt;
                goto LAB_001022a5;
              }
              piVar10 = __errno_location();
              in_stack_ffffffffffffff68 = strerror(*piVar10);
              _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,(int)in_R8,"realloc() failed: %s",
                     in_stack_ffffffffffffff68);
            }
LAB_001026f9:
            acStack_84[0] = -1;
            acStack_84[1] = -2;
            break;
          case 2:
            bVar18 = bVar18 & 0xf;
            ptVar9 = telnet->q;
            if (uVar4 != 0) {
              puVar12 = (uint *)0x0;
              do {
                if (ptVar9[(long)puVar12].telopt == bVar6) {
                  ptVar9[(long)puVar12].state = bVar18;
                  if (bVar6 == 0) {
                    bVar7 = (bVar1 & 0x9e) + 0x20;
                    if (bVar18 != 1) {
                      bVar7 = bVar1 & 0x9e;
                    }
                    telnet->flags = bVar7;
                  }
                  goto LAB_00102770;
                }
                puVar12 = (uint *)((long)puVar12 + 1);
              } while (puVar13 != puVar12);
            }
            if (uVar4 < telnet->q_size) {
LAB_00102310:
              ptVar9[(long)puVar13].telopt = bVar6;
              ptVar9[(long)puVar13].state = bVar18;
              telnet->q_cnt = (int)puVar13 + 1;
            }
            else {
              ptVar9 = (telnet_rfc1143_t *)realloc(ptVar9,(ulong)(telnet->q_size + 4) * 2);
              if (ptVar9 != (telnet_rfc1143_t *)0x0) {
                uVar16 = telnet->q_size;
                *(undefined8 *)(ptVar9 + uVar16) = 0;
                telnet->q = ptVar9;
                telnet->q_size = uVar16 + 4;
                puVar13 = (uint *)(ulong)telnet->q_cnt;
                goto LAB_00102310;
              }
              piVar10 = __errno_location();
              in_stack_ffffffffffffff68 = strerror(*piVar10);
              _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,(int)in_R8,"realloc() failed: %s",
                     in_stack_ffffffffffffff68);
            }
LAB_00102770:
            tStack_80.type = TELNET_EV_WONT;
            tStack_80.iac.cmd = bVar6;
            goto LAB_0010277d;
          case 3:
          case 5:
            bVar18 = bVar18 & 0xf;
            ptVar9 = telnet->q;
            if (uVar4 != 0) {
              puVar12 = (uint *)0x0;
              do {
                if (ptVar9[(long)puVar12].telopt == bVar6) {
                  ptVar9[(long)puVar12].state = bVar18;
                  if (bVar6 == 0) {
                    bVar6 = (bVar1 & 0x9e) + 0x20;
                    if (bVar18 != 1) {
                      bVar6 = bVar1 & 0x9e;
                    }
                    telnet->flags = bVar6;
                  }
                  goto switchD_00101f36_default;
                }
                puVar12 = (uint *)((long)puVar12 + 1);
              } while (puVar13 != puVar12);
            }
            if (uVar4 < telnet->q_size) {
LAB_00101fbe:
              ptVar9[(long)puVar13].telopt = bVar6;
              ptVar9[(long)puVar13].state = bVar18;
              telnet->q_cnt = (int)puVar13 + 1;
              goto switchD_00101f36_default;
            }
            ptVar9 = (telnet_rfc1143_t *)realloc(ptVar9,(ulong)(telnet->q_size + 4) * 2);
            if (ptVar9 != (telnet_rfc1143_t *)0x0) {
              uVar16 = telnet->q_size;
              *(undefined8 *)(ptVar9 + uVar16) = 0;
              telnet->q = ptVar9;
              telnet->q_size = uVar16 + 4;
              puVar13 = (uint *)(ulong)telnet->q_cnt;
              goto LAB_00101fbe;
            }
            piVar10 = __errno_location();
            in_stack_ffffffffffffff68 = strerror(*piVar10);
            uVar16 = 0x151;
            func = "_set_rfc1143";
            tVar8 = TELNET_ENOMEM;
            fmt = "realloc() failed: %s";
            goto LAB_0010280f;
          case 4:
            bVar18 = bVar18 & 0xf;
            ptVar9 = telnet->q;
            if (uVar4 != 0) {
              puVar12 = (uint *)0x0;
              do {
                if (ptVar9[(long)puVar12].telopt == bVar6) {
                  ptVar9[(long)puVar12].state = bVar18 + 0x30;
                  if (bVar6 == 0) {
                    bVar7 = (bVar1 & 0x9e) + 0x20;
                    if (bVar18 != 1) {
                      bVar7 = bVar1 & 0x9e;
                    }
                    telnet->flags = bVar7;
                  }
                  goto LAB_001026be;
                }
                puVar12 = (uint *)((long)puVar12 + 1);
              } while (puVar13 != puVar12);
            }
            if (uVar4 < telnet->q_size) {
LAB_0010221d:
              ptVar9[(long)puVar13].telopt = bVar6;
              ptVar9[(long)puVar13].state = bVar18 | 0x30;
              telnet->q_cnt = (int)puVar13 + 1;
            }
            else {
              ptVar9 = (telnet_rfc1143_t *)realloc(ptVar9,(ulong)(telnet->q_size + 4) * 2);
              if (ptVar9 != (telnet_rfc1143_t *)0x0) {
                uVar16 = telnet->q_size;
                *(undefined8 *)(ptVar9 + uVar16) = 0;
                telnet->q = ptVar9;
                telnet->q_size = uVar16 + 4;
                puVar13 = (uint *)(ulong)telnet->q_cnt;
                goto LAB_0010221d;
              }
              piVar10 = __errno_location();
              in_stack_ffffffffffffff68 = strerror(*piVar10);
              _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,(int)in_R8,"realloc() failed: %s",
                     in_stack_ffffffffffffff68);
            }
LAB_001026be:
            acStack_84[0] = -1;
            acStack_84[1] = -3;
            break;
          default:
            goto switchD_00101f36_default;
          }
          tStack_80.type = TELNET_EV_SEND;
          tStack_80.data.buffer = acStack_84;
          tStack_80.data.size = 3;
          acStack_84[2] = bVar6;
          (*telnet->eh)(telnet,&tStack_80,telnet->ud);
          tStack_80.type = TELNET_EV_WONT;
          goto LAB_0010288d;
        case TELNET_STATE_DO:
          switch(uVar11 >> 8 & 0xf) {
          case 0:
            ptVar5 = telnet->telopts;
            if (ptVar5 != (telnet_telopt_t *)0x0) {
              sVar2 = ptVar5->telopt;
              while (sVar2 != -1) {
                if ((int)sVar2 == uVar16) {
                  if (ptVar5->us == 0xfb) {
                    _set_rfc1143(telnet,bVar6,'\x01',bVar18 >> 4);
                    acStack_84[0] = -1;
                    acStack_84[1] = -5;
                    goto LAB_00102409;
                  }
                  break;
                }
                sVar2 = ptVar5[1].telopt;
                ptVar5 = ptVar5 + 1;
              }
            }
            acStack_84[0] = -1;
            acStack_84[1] = -4;
            goto LAB_00102667;
          default:
            goto switchD_00101f36_default;
          case 2:
            _set_rfc1143(telnet,bVar6,'\0',bVar18 >> 4);
            tStack_80.type = TELNET_EV_DONT;
            tStack_80.iac.cmd = bVar6;
            (*telnet->eh)(telnet,&tStack_80,telnet->ud);
            uVar16 = 0x1cf;
            break;
          case 3:
            _set_rfc1143(telnet,bVar6,'\x01',bVar18 >> 4);
            tStack_80.type = TELNET_EV_DO;
            tStack_80.iac.cmd = bVar6;
            goto LAB_0010277d;
          case 4:
            _set_rfc1143(telnet,bVar6,'\x01',bVar18 >> 4);
            uVar16 = 0x1d4;
            break;
          case 5:
            _set_rfc1143(telnet,bVar6,'\x02',bVar18 >> 4);
            acStack_84[0] = -1;
            acStack_84[1] = -4;
LAB_00102409:
            tStack_80.type = TELNET_EV_SEND;
            tStack_80.data.buffer = acStack_84;
            tStack_80.data.size = 3;
            acStack_84[2] = bVar6;
            (*telnet->eh)(telnet,&tStack_80,telnet->ud);
            tStack_80.type = TELNET_EV_DO;
            goto LAB_0010288d;
          }
          func = "_negotiate";
          tVar8 = TELNET_EPROTOCOL;
          fmt = "WONT answered by DO";
          goto LAB_0010280f;
        case TELNET_STATE_DONT:
          switch(uVar11 >> 8 & 0xf) {
          case 1:
            _set_rfc1143(telnet,bVar6,'\0',bVar18 >> 4);
            acStack_84[0] = -1;
            acStack_84[1] = -4;
            goto LAB_0010216f;
          case 2:
            _set_rfc1143(telnet,bVar6,'\0',bVar18 >> 4);
            tStack_80.type = TELNET_EV_DONT;
            tStack_80.iac.cmd = bVar6;
            goto LAB_0010277d;
          case 3:
          case 5:
            _set_rfc1143(telnet,bVar6,'\0',bVar18 >> 4);
            break;
          case 4:
            _set_rfc1143(telnet,bVar6,'\x03',bVar18 >> 4);
            acStack_84[0] = -1;
            acStack_84[1] = -5;
LAB_0010216f:
            tStack_80.type = TELNET_EV_SEND;
            tStack_80.data.buffer = acStack_84;
            tStack_80.data.size = 3;
            acStack_84[2] = bVar6;
            (*telnet->eh)(telnet,&tStack_80,telnet->ud);
            tStack_80.type = TELNET_EV_DONT;
LAB_0010288d:
            ptVar17 = &tStack_80;
            pvVar14 = telnet->ud;
            tStack_80.iac.cmd = bVar6;
            goto LAB_00102788;
          }
          goto switchD_00101f36_default;
        }
        in_R8 = &switchD_00101e36::switchdataD_001055c8;
        switch(uVar11 >> 0xc) {
        case 0:
          ptVar5 = telnet->telopts;
          if (ptVar5 != (telnet_telopt_t *)0x0) {
            sVar2 = ptVar5->telopt;
            while (sVar2 != -1) {
              if ((int)sVar2 == uVar16) {
                if (ptVar5->him == 0xfd) {
                  _set_rfc1143(telnet,bVar6,bVar18 & 0xf,'\x01');
                  acStack_84[0] = -1;
                  acStack_84[1] = -3;
                  goto LAB_00102854;
                }
                break;
              }
              sVar2 = ptVar5[1].telopt;
              ptVar5 = ptVar5 + 1;
            }
          }
          acStack_84[0] = -1;
          acStack_84[1] = -2;
LAB_00102667:
          tStack_80.type = TELNET_EV_SEND;
          tStack_80.data.buffer = acStack_84;
          tStack_80.data.size = 3;
          acStack_84[2] = bVar6;
          break;
        default:
          goto switchD_00101f36_default;
        case 2:
          bVar18 = bVar18 & 0xf;
          ptVar9 = telnet->q;
          if (uVar4 != 0) {
            puVar12 = (uint *)0x0;
            do {
              if (ptVar9[(long)puVar12].telopt == bVar6) {
                ptVar9[(long)puVar12].state = bVar18;
                if (bVar6 == 0) {
                  bVar7 = (bVar1 & 0x9e) + 0x20;
                  if (bVar18 != 1) {
                    bVar7 = bVar1 & 0x9e;
                  }
                  telnet->flags = bVar7;
                }
                goto LAB_001027d9;
              }
              puVar12 = (uint *)((long)puVar12 + 1);
            } while (puVar13 != puVar12);
          }
          if (uVar4 < telnet->q_size) {
LAB_001023dd:
            ptVar9[(long)puVar13].telopt = bVar6;
            ptVar9[(long)puVar13].state = bVar18;
            telnet->q_cnt = (int)puVar13 + 1;
          }
          else {
            ptVar9 = (telnet_rfc1143_t *)realloc(ptVar9,(ulong)(telnet->q_size + 4) * 2);
            if (ptVar9 != (telnet_rfc1143_t *)0x0) {
              uVar16 = telnet->q_size;
              *(undefined8 *)(ptVar9 + uVar16) = 0;
              telnet->q = ptVar9;
              telnet->q_size = uVar16 + 4;
              puVar13 = (uint *)(ulong)telnet->q_cnt;
              goto LAB_001023dd;
            }
            piVar10 = __errno_location();
            in_stack_ffffffffffffff68 = strerror(*piVar10);
            _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,(int)in_R8,"realloc() failed: %s",
                   in_stack_ffffffffffffff68);
          }
LAB_001027d9:
          tStack_80.type = TELNET_EV_WONT;
          tStack_80.iac.cmd = bVar6;
          (*telnet->eh)(telnet,&tStack_80,telnet->ud);
          uVar16 = 0x195;
          goto LAB_001027fc;
        case 3:
          _set_rfc1143(telnet,bVar6,bVar18 & 0xf,'\x01');
          tStack_80.type = TELNET_EV_WILL;
          tStack_80.iac.cmd = bVar6;
          break;
        case 4:
          _set_rfc1143(telnet,bVar6,bVar18 & 0xf,'\x01');
          uVar16 = 0x19a;
LAB_001027fc:
          func = "_negotiate";
          tVar8 = TELNET_EPROTOCOL;
          fmt = "DONT answered by WILL";
LAB_0010280f:
          _error(telnet,uVar16,func,tVar8,(int)in_R8,fmt);
          goto switchD_00101f36_default;
        case 5:
          bVar18 = bVar18 & 0xf;
          ptVar9 = telnet->q;
          if (uVar4 != 0) {
            puVar12 = (uint *)0x0;
            do {
              if (ptVar9[(long)puVar12].telopt == bVar6) {
                ptVar9[(long)puVar12].state = bVar18 + 0x20;
                if (bVar6 == 0) {
                  bVar7 = (bVar1 & 0x9e) + 0x20;
                  if (bVar18 != 1) {
                    bVar7 = bVar1 & 0x9e;
                  }
                  telnet->flags = bVar7;
                }
                goto LAB_0010284d;
              }
              puVar12 = (uint *)((long)puVar12 + 1);
            } while (puVar13 != puVar12);
          }
          if (uVar4 < telnet->q_size) {
LAB_001024be:
            ptVar9[(long)puVar13].telopt = bVar6;
            ptVar9[(long)puVar13].state = bVar18 | 0x20;
            telnet->q_cnt = (int)puVar13 + 1;
          }
          else {
            ptVar9 = (telnet_rfc1143_t *)realloc(ptVar9,(ulong)(telnet->q_size + 4) * 2);
            if (ptVar9 != (telnet_rfc1143_t *)0x0) {
              uVar16 = telnet->q_size;
              *(undefined8 *)(ptVar9 + uVar16) = 0;
              telnet->q = ptVar9;
              telnet->q_size = uVar16 + 4;
              puVar13 = (uint *)(ulong)telnet->q_cnt;
              goto LAB_001024be;
            }
            piVar10 = __errno_location();
            in_stack_ffffffffffffff68 = strerror(*piVar10);
            _error(telnet,0x151,"_set_rfc1143",TELNET_ENOMEM,(int)in_R8,"realloc() failed: %s",
                   in_stack_ffffffffffffff68);
          }
LAB_0010284d:
          acStack_84[0] = -1;
          acStack_84[1] = -2;
LAB_00102854:
          tStack_80.type = TELNET_EV_SEND;
          tStack_80.data.buffer = acStack_84;
          tStack_80.data.size = 3;
          acStack_84[2] = bVar6;
          (*telnet->eh)(telnet,&tStack_80,telnet->ud);
          tStack_80.type = TELNET_EV_WILL;
          goto LAB_0010288d;
        }
LAB_0010277d:
        pvVar14 = telnet->ud;
        ptVar17 = &tStack_80;
LAB_00102788:
        (*telnet->eh)(telnet,ptVar17,pvVar14);
switchD_00101f36_default:
        lVar20 = sVar15 + 1;
LAB_0010278f:
        telnet->state = TELNET_STATE_DATA;
        break;
      case TELNET_STATE_SB:
        telnet->sb_telopt = bVar6;
        telnet->buffer_pos = 0;
LAB_00101d5c:
        telnet->state = TELNET_STATE_SB_DATA;
        break;
      case TELNET_STATE_SB_DATA:
        if (bVar6 == 0xff) {
          telnet->state = TELNET_STATE_SB_DATA_IAC;
        }
        else {
          if (bVar6 == 0xfb && telnet->sb_telopt == 'U') {
            lVar20 = sVar15 + 2;
            goto LAB_0010278f;
          }
          tVar8 = _buffer_byte(telnet,bVar6);
          if (tVar8 != TELNET_EOK) goto switchD_00101f36_default;
        }
        break;
      case TELNET_STATE_SB_DATA_IAC:
        if (bVar6 == 0xff) {
          tVar8 = _buffer_byte(telnet,0xff);
          if (tVar8 != TELNET_EOK) goto switchD_00101f36_default;
          goto LAB_00101d5c;
        }
        if (bVar6 == 0xf0) {
          lVar20 = sVar15 + 1;
          telnet->state = TELNET_STATE_DATA;
          _subnegotiate(telnet);
        }
        else {
          in_stack_ffffffffffffff68 =
               (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff68 >> 0x20),uVar16);
          _error(telnet,0x472,"_process",TELNET_EPROTOCOL,(int)in_R8,
                 "unexpected byte after IAC inside SB: %d",in_stack_ffffffffffffff68);
          telnet->state = TELNET_STATE_IAC;
          _subnegotiate(telnet);
          lVar20 = sVar15 + 1;
          _process(telnet,(char *)&bStack_81,1);
        }
      }
LAB_00102796:
      sVar15 = sVar15 + 1;
    } while (sVar15 != size);
    if ((telnet->state == TELNET_STATE_DATA) &&
       (tStack_58.error.func = (char *)(size - lVar20), (char *)tStack_58.data.size != (char *)0x0))
    {
      tStack_58.type = TELNET_EV_DATA;
      tStack_58.data.buffer = buffer + lVar20;
      (*telnet->eh)(telnet,&tStack_58,telnet->ud);
    }
  }
  return;
}

Assistant:

void telnet_recv(telnet_t *telnet, const char *buffer,
		size_t size) {
#if defined(HAVE_ZLIB)
	/* if we have an inflate (decompression) zlib stream, use it */
	if (telnet->z != 0 && !(telnet->flags & TELNET_PFLAG_DEFLATE)) {
		char inflate_buffer[1024];
		int rs;

		/* initialize zlib state */
		telnet->z->next_in = (unsigned char*)buffer;
		telnet->z->avail_in = (unsigned int)size;
		telnet->z->next_out = (unsigned char *)inflate_buffer;
		telnet->z->avail_out = sizeof(inflate_buffer);

		/* inflate until buffer exhausted and all output is produced */
		while (telnet->z->avail_in > 0 || telnet->z->avail_out == 0) {
			/* reset output buffer */

			/* decompress */
			rs = inflate(telnet->z, Z_SYNC_FLUSH);

			/* process the decompressed bytes on success */
			if (rs == Z_OK || rs == Z_STREAM_END)
				_process(telnet, inflate_buffer, sizeof(inflate_buffer) -
						telnet->z->avail_out);
			else
				_error(telnet, __LINE__, __func__, TELNET_ECOMPRESS, 1,
						"inflate() failed: %s", zError(rs));

			/* prepare output buffer for next run */
			telnet->z->next_out = (unsigned char *)inflate_buffer;
			telnet->z->avail_out = sizeof(inflate_buffer);

			/* on error (or on end of stream) disable further inflation */
			if (rs != Z_OK) {
				telnet_event_t ev;

				/* disable compression */
				inflateEnd(telnet->z);
				free(telnet->z);
				telnet->z = 0;

				/* send event */
				ev.type = TELNET_EV_COMPRESS;
				ev.compress.state = 0;
				telnet->eh(telnet, &ev, telnet->ud);

				break;
			}
		}

	/* COMPRESS2 is not negotiated, just process */
	} else
#endif /* defined(HAVE_ZLIB) */
		_process(telnet, buffer, size);
}